

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixWrite(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  bool bVar1;
  int iVar2;
  int local_3c;
  int nCopy;
  int wrote;
  unixFile *pFile;
  sqlite3_int64 offset_local;
  void *pvStack_20;
  int amt_local;
  void *pBuf_local;
  sqlite3_file *id_local;
  
  local_3c = 0;
  pFile = (unixFile *)offset;
  offset_local._4_4_ = amt;
  pvStack_20 = pBuf;
  if (offset < (long)id[10].pMethods) {
    if (offset + amt <= (long)id[10].pMethods) {
      memcpy((void *)((long)&(id[0xd].pMethods)->iVersion + offset),pBuf,(long)amt);
      return 0;
    }
    iVar2 = (int)id[10].pMethods - (int)offset;
    memcpy((void *)((long)&(id[0xd].pMethods)->iVersion + offset),pBuf,(long)iVar2);
    pvStack_20 = (void *)((long)pBuf + (long)iVar2);
    offset_local._4_4_ = amt - iVar2;
    pFile = (unixFile *)(iVar2 + offset);
  }
  while( true ) {
    bVar1 = false;
    if (0 < offset_local._4_4_) {
      local_3c = seekAndWrite((unixFile *)id,(i64)pFile,pvStack_20,offset_local._4_4_);
      bVar1 = 0 < local_3c;
    }
    if (!bVar1) break;
    offset_local._4_4_ = offset_local._4_4_ - local_3c;
    pFile = (unixFile *)((long)&pFile->pMethod + (long)local_3c);
    pvStack_20 = (void *)((long)pvStack_20 + (long)local_3c);
  }
  if (offset_local._4_4_ < 1) {
    id_local._4_4_ = 0;
  }
  else if ((local_3c < 0) && (*(int *)&id[4].pMethods != 0x1c)) {
    id_local._4_4_ = 0x30a;
  }
  else {
    *(undefined4 *)&id[4].pMethods = 0;
    id_local._4_4_ = 0xd;
  }
  return id_local._4_4_;
}

Assistant:

static int unixWrite(
  sqlite3_file *id, 
  const void *pBuf, 
  int amt,
  sqlite3_int64 offset 
){
  unixFile *pFile = (unixFile*)id;
  int wrote = 0;
  assert( id );
  assert( amt>0 );

  /* If this is a database file (not a journal, master-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE 
  );
#endif

#ifdef SQLITE_DEBUG
  /* If we are doing a normal write to a database file (as opposed to
  ** doing a hot-journal rollback or a write to some file other than a
  ** normal database file) then record the fact that the database
  ** has changed.  If the transaction counter is modified, record that
  ** fact too.
  */
  if( pFile->inNormalWrite ){
    pFile->dbUpdate = 1;  /* The database has been modified */
    if( offset<=24 && offset+amt>=27 ){
      int rc;
      char oldCntr[4];
      SimulateIOErrorBenign(1);
      rc = seekAndRead(pFile, 24, oldCntr, 4);
      SimulateIOErrorBenign(0);
      if( rc!=4 || memcmp(oldCntr, &((char*)pBuf)[24-offset], 4)!=0 ){
        pFile->transCntrChng = 1;  /* The transaction counter has changed */
      }
    }
  }
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this write request as possible by transfering
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(&((u8 *)(pFile->pMapRegion))[offset], pBuf, amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(&((u8 *)(pFile->pMapRegion))[offset], pBuf, nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  while( amt>0 && (wrote = seekAndWrite(pFile, offset, pBuf, amt))>0 ){
    amt -= wrote;
    offset += wrote;
    pBuf = &((char*)pBuf)[wrote];
  }
  SimulateIOError(( wrote=(-1), amt=1 ));
  SimulateDiskfullError(( wrote=0, amt=1 ));

  if( amt>0 ){
    if( wrote<0 && pFile->lastErrno!=ENOSPC ){
      /* lastErrno set by seekAndWrite */
      return SQLITE_IOERR_WRITE;
    }else{
      pFile->lastErrno = 0; /* not a system error */
      return SQLITE_FULL;
    }
  }

  return SQLITE_OK;
}